

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_ObjCutFilter(Jf_Man_t *p,Jf_Cut_t **pSto,int c)

{
  Jf_Cut_t *pJVar1;
  Jf_Cut_t *pJVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  if (0 < c) {
    uVar5 = (ulong)(uint)c;
  }
  if (p->pPars->fCutMin == 0) {
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pJVar1 = pSto[c];
      pJVar2 = pSto[uVar4];
      if (((pJVar2->pCut[0] <= pJVar1->pCut[0]) && ((pJVar2->Sign & ~pJVar1->Sign) == 0)) &&
         (iVar3 = Jf_CutIsContainedOrder(pJVar1->pCut,pJVar2->pCut), iVar3 != 0)) {
        return 0;
      }
    }
  }
  else {
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pJVar1 = pSto[c];
      pJVar2 = pSto[uVar4];
      if (((pJVar2->pCut[0] <= pJVar1->pCut[0]) && ((pJVar2->Sign & ~pJVar1->Sign) == 0)) &&
         (iVar3 = Jf_CutIsContained1(pJVar1->pCut,pJVar2->pCut), iVar3 != 0)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Jf_ObjCutFilter( Jf_Man_t * p, Jf_Cut_t ** pSto, int c )
{
    int k;
    if ( p->pPars->fCutMin )
    {
        for ( k = 0; k < c; k++ )
            if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
                (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
                 Jf_CutIsContained1(pSto[c]->pCut, pSto[k]->pCut) )
                 return 0;
    }
    else
    {
        for ( k = 0; k < c; k++ )
            if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
                (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
                 Jf_CutIsContainedOrder(pSto[c]->pCut, pSto[k]->pCut) )
                 return 0;
    }
    return 1;
}